

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_font * nk_font_atlas_add(nk_font_atlas *atlas,nk_font_config *config)

{
  nk_font_config *pnVar1;
  nk_font *dst0;
  void *pvVar2;
  nk_font_config *c;
  nk_font *f;
  nk_font *i_1;
  nk_font_config *i;
  nk_font_config *cfg;
  nk_font *font;
  nk_font_config *config_local;
  nk_font_atlas *atlas_local;
  
  cfg = (nk_font_config *)0x0;
  if (atlas == (nk_font_atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x3462,
                  "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                 );
  }
  if ((atlas->permanent).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->permanent.alloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x3463,
                  "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                 );
  }
  if ((atlas->permanent).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->permanent.free",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x3464,
                  "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                 );
  }
  if ((atlas->temporary).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->temporary.alloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x3465,
                  "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                 );
  }
  if ((atlas->temporary).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->temporary.free",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x3466,
                  "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                 );
  }
  if (config == (nk_font_config *)0x0) {
    __assert_fail("config",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x3468,
                  "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                 );
  }
  if (config->ttf_blob == (void *)0x0) {
    __assert_fail("config->ttf_blob",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x3469,
                  "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                 );
  }
  if (config->ttf_size != 0) {
    if (config->size <= 0.0) {
      __assert_fail("config->size > 0.0f",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                    ,0x346b,
                    "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                   );
    }
    if ((((((atlas == (nk_font_atlas *)0x0) || (config == (nk_font_config *)0x0)) ||
          (config->ttf_blob == (void *)0x0)) || ((config->ttf_size == 0 || (config->size <= 0.0))))
        || (((atlas->permanent).alloc == (nk_plugin_alloc)0x0 ||
            (((atlas->permanent).free == (nk_plugin_free)0x0 ||
             ((atlas->temporary).alloc == (nk_plugin_alloc)0x0)))))) ||
       ((atlas->temporary).free == (nk_plugin_free)0x0)) {
      atlas_local = (nk_font_atlas *)0x0;
    }
    else {
      dst0 = (nk_font *)(*(atlas->permanent).alloc)((atlas->permanent).userdata,(void *)0x0,0x58);
      nk_memcopy(dst0,config,0x58);
      (dst0->info).ranges = (nk_rune *)dst0;
      *(nk_font **)&dst0->scale = dst0;
      if (config->merge_mode == '\0') {
        if (atlas->config == (nk_font_config *)0x0) {
          atlas->config = (nk_font_config *)dst0;
          dst0->next = (nk_font *)0x0;
        }
        else {
          for (i_1 = (nk_font *)atlas->config; i_1->next != (nk_font *)0x0; i_1 = i_1->next) {
          }
          i_1->next = dst0;
          dst0->next = (nk_font *)0x0;
        }
        cfg = (nk_font_config *)
              (*(atlas->permanent).alloc)((atlas->permanent).userdata,(void *)0x0,0x80);
        if ((nk_font *)cfg == (nk_font *)0x0) {
          __assert_fail("font",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                        ,0x3487,
                        "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                       );
        }
        nk_zero(cfg,0x80);
        if ((nk_font *)cfg == (nk_font *)0x0) {
          return (nk_font *)0x0;
        }
        ((nk_font *)cfg)->config = (nk_font_config *)dst0;
        if (atlas->fonts == (nk_font *)0x0) {
          atlas->fonts = (nk_font *)cfg;
          ((nk_font *)cfg)->next = (nk_font *)0x0;
        }
        else {
          for (f = atlas->fonts; f->next != (nk_font *)0x0; f = f->next) {
          }
          f->next = (nk_font *)cfg;
          ((nk_font *)cfg)->next = (nk_font *)0x0;
        }
        *(nk_baked_font **)&(dst0->info).descent = &((nk_font *)cfg)->info;
      }
      else {
        if (atlas->font_num == 0) {
          __assert_fail("atlas->font_num",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                        ,0x349b,
                        "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                       );
        }
        pnVar1 = atlas->fonts->config;
        *(nk_baked_font **)&(dst0->info).descent = &atlas->fonts->info;
        (dst0->info).ranges = (nk_rune *)pnVar1;
        *(nk_font_config **)&dst0->scale = pnVar1->p;
        pnVar1->p->n = (nk_font_config *)dst0;
        pnVar1->p = (nk_font_config *)dst0;
      }
      if (config->ttf_data_owned_by_atlas == '\0') {
        pvVar2 = (*(atlas->permanent).alloc)
                           ((atlas->permanent).userdata,(void *)0x0,
                            *(nk_size *)&(dst0->handle).height);
        (dst0->handle).userdata.ptr = pvVar2;
        if ((dst0->handle).userdata.ptr == (void *)0x0) {
          __assert_fail("cfg->ttf_blob",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                        ,0x34a8,
                        "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                       );
        }
        if ((dst0->handle).userdata.ptr == (void *)0x0) {
          atlas->font_num = atlas->font_num + 1;
          return (nk_font *)0x0;
        }
        nk_memcopy((dst0->handle).userdata.ptr,config->ttf_blob,*(nk_size *)&(dst0->handle).height);
        *(uchar *)&(dst0->handle).width = '\x01';
      }
      atlas->font_num = atlas->font_num + 1;
      atlas_local = (nk_font_atlas *)cfg;
    }
    return (nk_font *)atlas_local;
  }
  __assert_fail("config->ttf_size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x346a,
                "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
               );
}

Assistant:

NK_API struct nk_font*
nk_font_atlas_add(struct nk_font_atlas *atlas, const struct nk_font_config *config)
{
    struct nk_font *font = 0;
    struct nk_font_config *cfg;

    NK_ASSERT(atlas);
    NK_ASSERT(atlas->permanent.alloc);
    NK_ASSERT(atlas->permanent.free);
    NK_ASSERT(atlas->temporary.alloc);
    NK_ASSERT(atlas->temporary.free);

    NK_ASSERT(config);
    NK_ASSERT(config->ttf_blob);
    NK_ASSERT(config->ttf_size);
    NK_ASSERT(config->size > 0.0f);

    if (!atlas || !config || !config->ttf_blob || !config->ttf_size || config->size <= 0.0f||
        !atlas->permanent.alloc || !atlas->permanent.free ||
        !atlas->temporary.alloc || !atlas->temporary.free)
        return 0;

    /* allocate font config  */
    cfg = (struct nk_font_config*)
        atlas->permanent.alloc(atlas->permanent.userdata,0, sizeof(struct nk_font_config));
    NK_MEMCPY(cfg, config, sizeof(*config));
    cfg->n = cfg;
    cfg->p = cfg;

    if (!config->merge_mode) {
        /* insert font config into list */
        if (!atlas->config) {
            atlas->config = cfg;
            cfg->next = 0;
        } else {
            struct nk_font_config *i = atlas->config;
            while (i->next) i = i->next;
            i->next = cfg;
            cfg->next = 0;
        }
        /* allocate new font */
        font = (struct nk_font*)
            atlas->permanent.alloc(atlas->permanent.userdata,0, sizeof(struct nk_font));
        NK_ASSERT(font);
        nk_zero(font, sizeof(*font));
        if (!font) return 0;
        font->config = cfg;

        /* insert font into list */
        if (!atlas->fonts) {
            atlas->fonts = font;
            font->next = 0;
        } else {
            struct nk_font *i = atlas->fonts;
            while (i->next) i = i->next;
            i->next = font;
            font->next = 0;
        }
        cfg->font = &font->info;
    } else {
        /* extend previously added font */
        struct nk_font *f = 0;
        struct nk_font_config *c = 0;
        NK_ASSERT(atlas->font_num);
        f = atlas->fonts;
        c = f->config;
        cfg->font = &f->info;

        cfg->n = c;
        cfg->p = c->p;
        c->p->n = cfg;
        c->p = cfg;
    }
    /* create own copy of .TTF font blob */
    if (!config->ttf_data_owned_by_atlas) {
        cfg->ttf_blob = atlas->permanent.alloc(atlas->permanent.userdata,0, cfg->ttf_size);
        NK_ASSERT(cfg->ttf_blob);
        if (!cfg->ttf_blob) {
            atlas->font_num++;
            return 0;
        }
        NK_MEMCPY(cfg->ttf_blob, config->ttf_blob, cfg->ttf_size);
        cfg->ttf_data_owned_by_atlas = 1;
    }
    atlas->font_num++;
    return font;
}